

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_utils.cpp
# Opt level: O1

string * str_utils::escape(string *__return_storage_ptr__,string *str,char c)

{
  long lVar1;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (0 < (int)str->_M_string_length) {
    lVar1 = 0;
    do {
      if ((str->_M_dataplus)._M_p[lVar1] == c) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct((ulong)local_50,'\x01');
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_50[0]);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      lVar1 = lVar1 + 1;
    } while (lVar1 < (int)str->_M_string_length);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string escape(const std::string& str, char c) {
    std::string escaped_str;
    for (int i = 0; i < int(str.size()); i++) {
        if (str[i] == c)
            escaped_str += "\\";
        escaped_str += std::string(1, str[i]);
    }
    return escaped_str;
}